

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O0

int cuddIsInDeathRow(DdManager *dd,DdNode *f)

{
  int local_24;
  int i;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_24 = 0;
  while( true ) {
    if (dd->deathRowDepth <= local_24) {
      return -1;
    }
    if (f == dd->deathRow[local_24]) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int
cuddIsInDeathRow(
  DdManager *dd,
  DdNode *f)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    for (i = 0; i < dd->deathRowDepth; i++) {
        if (f == dd->deathRow[i]) {
            return(i);
        }
    }
#endif

    return(-1);

}